

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

RepeatedField<float> *
google::protobuf::Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
Construct<google::protobuf::Arena*>(void *ptr,Arena **args)

{
  internal::ShortSooRep::ShortSooRep((ShortSooRep *)ptr,*args);
  if ((*ptr & 4) != 0) {
    internal::LongSooRep::elements((LongSooRep *)ptr);
  }
  return (RepeatedField<float> *)ptr;
}

Assistant:

static T* PROTOBUF_NONNULL Construct(void* PROTOBUF_NONNULL ptr,
                                         Args&&... args) {
      return new (ptr) T(static_cast<Args&&>(args)...);
    }